

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_json.c
# Opt level: O0

char * parse_string(cJSON *item,char *str)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  uint local_44;
  uint local_40;
  uint uc2;
  uint uc;
  int len;
  char *out;
  char *ptr2;
  char *ptr;
  char *str_local;
  cJSON *item_local;
  
  uc2 = 0;
  pcVar2 = str;
  pcVar1 = str + 1;
  if (*str == '\"') {
    while( true ) {
      ptr2 = pcVar1;
      bVar3 = false;
      if ((*ptr2 != '\"') && (bVar3 = false, *ptr2 != '\0')) {
        uc2 = uc2 + 1;
        bVar3 = uc2 != 0;
      }
      if (!bVar3) break;
      pcVar1 = ptr2 + 1;
      if (*ptr2 == '\\') {
        pcVar1 = ptr2 + 2;
      }
    }
    ptr = str;
    str_local = (char *)item;
    _uc = (char *)(*cJSON_malloc)((long)(int)(uc2 + 1));
    pcVar2 = ep;
    out = _uc;
    pcVar1 = ptr;
    if (_uc != (char *)0x0) {
LAB_001d6f09:
      while( true ) {
        ptr2 = pcVar1 + 1;
        bVar3 = false;
        if (*ptr2 != '\"') {
          bVar3 = *ptr2 != '\0';
        }
        if (!bVar3) {
          *out = '\0';
          if (*ptr2 == '\"') {
            ptr2 = pcVar1 + 2;
          }
          *(char **)(str_local + 0x20) = _uc;
          str_local[0x18] = '\x04';
          str_local[0x19] = '\0';
          str_local[0x1a] = '\0';
          str_local[0x1b] = '\0';
          return ptr2;
        }
        if (*ptr2 == '\\') break;
        *out = *ptr2;
        out = out + 1;
        pcVar1 = ptr2;
      }
      ptr2 = pcVar1 + 2;
      switch(*ptr2) {
      case 'b':
        *out = '\b';
        out = out + 1;
        pcVar1 = ptr2;
        goto LAB_001d6f09;
      default:
        *out = *ptr2;
        out = out + 1;
        pcVar1 = ptr2;
        goto LAB_001d6f09;
      case 'f':
        *out = '\f';
        out = out + 1;
        pcVar1 = ptr2;
        goto LAB_001d6f09;
      case 'n':
        *out = '\n';
        out = out + 1;
        pcVar1 = ptr2;
        goto LAB_001d6f09;
      case 'r':
        *out = '\r';
        out = out + 1;
        pcVar1 = ptr2;
        goto LAB_001d6f09;
      case 't':
        *out = '\t';
        out = out + 1;
        pcVar1 = ptr2;
        goto LAB_001d6f09;
      case 'u':
        goto switchD_001d6f9f_caseD_75;
      }
    }
  }
  ep = pcVar2;
  return (char *)0x0;
switchD_001d6f9f_caseD_75:
  __isoc99_sscanf(pcVar1 + 3,"%4x",&local_40);
  pcVar1 = ptr2 + 4;
  if (((local_40 < 0xdc00) || (0xdfff < local_40)) && (local_40 != 0)) {
    if ((0xd7ff < local_40) && (local_40 < 0xdc00)) {
      if ((ptr2[5] != '\\') || (ptr2[6] != 'u')) goto LAB_001d6f09;
      pcVar2 = ptr2 + 7;
      ptr2 = pcVar1;
      __isoc99_sscanf(pcVar2,"%4x",&local_44);
      pcVar1 = ptr2 + 6;
      if ((local_44 < 0xdc00) || (0xdfff < local_44)) goto LAB_001d6f09;
      local_40 = ((local_40 & 0x3ff) << 10 | local_44 & 0x3ff) + 0x10000;
    }
    ptr2 = pcVar1;
    uc2 = 4;
    if (local_40 < 0x80) {
      uc2 = 1;
    }
    else if (local_40 < 0x800) {
      uc2 = 2;
    }
    else if (local_40 < 0x10000) {
      uc2 = 3;
    }
    pcVar2 = out + (int)uc2;
    out = pcVar2;
    switch(uc2) {
    case 4:
      out = pcVar2 + -1;
      pcVar2[-1] = (byte)local_40 & 0xbf | 0x80;
      local_40 = local_40 >> 6;
    case 3:
      out[-1] = (byte)local_40 & 0xbf | 0x80;
      local_40 = local_40 >> 6;
      out = out + -1;
    case 2:
      out[-1] = (byte)local_40 & 0xbf | 0x80;
      local_40 = local_40 >> 6;
      out = out + -1;
    case 1:
      out[-1] = (byte)local_40 | ""[(int)uc2];
      out = out + -1;
    default:
      out = out + (int)uc2;
      pcVar1 = ptr2;
    }
  }
  goto LAB_001d6f09;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str)
{
	const char *ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {ep=str;return 0;}	/* not a string! */
	
	while (*ptr!='\"' && *ptr && ++len) if (*ptr++ == '\\') ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	
	ptr=str+1;ptr2=out;
	while (*ptr!='\"' && *ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					sscanf(ptr+1,"%4x",&uc);ptr+=4;	/* get the unicode char. */

					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)	break;	/* check for invalid.	*/

					if (uc>=0xD800 && uc<=0xDBFF)	/* UTF16 surrogate pairs.	*/
					{
						if (ptr[1]!='\\' || ptr[2]!='u')	break;	/* missing second-half of surrogate.	*/
						sscanf(ptr+3,"%4x",&uc2);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)		break;	/* invalid second-half of surrogate.	*/
						uc=0x10000 + (((uc&0x3FF)<<10) | (uc2&0x3FF));
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	item->valuestring=out;
	item->type=cJSON_String;
	return ptr;
}